

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLParser.cpp
# Opt level: O1

void iDynTree::XMLParser::XMLParserPimpl::parserCallbackEndDocument(void *context)

{
  long lVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  char cVar2;
  
  if (*(char *)(*context + 0x1a1) == '\x01') {
    iDynTree::reportInfo("XMLParser","parserCallbackEndDocument","End document");
  }
  cVar2 = (**(code **)(**(long **)(*context + 0x170) + 0x18))();
  if (cVar2 == '\0') {
    iDynTree::reportError
              ("XMLParser","parserCallbackEndDocument","Document final callback failed processing");
  }
  lVar1 = *context;
  if (*(long *)(lVar1 + 0x130) != *(long *)(lVar1 + 0x110)) {
    this = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar1 + 0x178);
    *(undefined8 *)(lVar1 + 0x170) = 0;
    *(undefined8 *)(lVar1 + 0x178) = 0;
    if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
    }
    iDynTree::reportError("XMLParser","parserCallbackEndDocument","Unbalanced tags in the document")
    ;
    return;
  }
  return;
}

Assistant:

void XMLParser::XMLParserPimpl::parserCallbackEndDocument(void* context)
    {
        XMLParser *state = static_cast<XMLParser*>(context);
        if (state->m_pimpl->m_logParsing) {
            reportInfo("XMLParser", "parserCallbackEndDocument", "End document");
        }

        if (!state->m_pimpl->m_document->documentHasBeenParsed()) {
            reportError("XMLParser", "parserCallbackEndDocument", "Document final callback failed processing");
        }
        
        if (!state->m_pimpl->m_parsedTrace.empty()) {
            // This is an error. Reset the document as it is invalid
            state->m_pimpl->m_document.reset();
            reportError("XMLParser", "parserCallbackEndDocument", "Unbalanced tags in the document");
        }
        
    }